

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

bool __thiscall
Parameter<bool>::internalSetData<std::vector<double,std::allocator<double>>>
          (Parameter<bool> *this,vector<double,_std::allocator<double>_> *data)

{
  _Vector_base<double,_std::allocator<double>_> local_20;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_20,data);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_20);
  return false;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }